

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O0

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  MessageType t;
  bool bVar2;
  reference pbVar3;
  cmMessenger *this_00;
  bool local_25a;
  byte local_1fa;
  undefined1 local_1d8 [24];
  cmMessenger *m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_190;
  undefined1 local_180 [8];
  string message;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  byte local_bb;
  byte local_ba;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  byte local_6e;
  byte local_6d;
  MessageType local_6c;
  bool fatal;
  bool status;
  const_iterator cStack_68;
  MessageType type;
  const_iterator i;
  allocator<char> local_49;
  string local_48;
  _Base_ptr local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmMessageCommand *this_local;
  
  local_28 = (_Base_ptr)param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    cStack_68 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local);
    local_6c = MESSAGE;
    local_6d = 0;
    local_6e = 0;
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&stack0xffffffffffffff98);
    bVar2 = std::operator==(pbVar3,"SEND_ERROR");
    if (bVar2) {
      local_6c = FATAL_ERROR;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&stack0xffffffffffffff98);
    }
    else {
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&stack0xffffffffffffff98);
      bVar2 = std::operator==(pbVar3,"FATAL_ERROR");
      if (bVar2) {
        local_6e = 1;
        local_6c = FATAL_ERROR;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&stack0xffffffffffffff98);
      }
      else {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&stack0xffffffffffffff98);
        bVar2 = std::operator==(pbVar3,"WARNING");
        if (bVar2) {
          local_6c = WARNING;
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&stack0xffffffffffffff98);
        }
        else {
          pbVar3 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&stack0xffffffffffffff98);
          bVar2 = std::operator==(pbVar3,"AUTHOR_WARNING");
          if (bVar2) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            local_ba = 0;
            local_bb = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_91);
            bVar2 = cmMakefile::IsSet(pcVar1,&local_90);
            local_1fa = 0;
            if (bVar2) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              local_ba = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_b8,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_b9);
              local_bb = 1;
              bVar2 = cmMakefile::IsOn(pcVar1,&local_b8);
              local_1fa = bVar2 ^ 0xff;
            }
            if ((local_bb & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_b8);
            }
            if ((local_ba & 1) != 0) {
              std::allocator<char>::~allocator(&local_b9);
            }
            std::__cxx11::string::~string((string *)&local_90);
            std::allocator<char>::~allocator(&local_91);
            if ((local_1fa & 1) == 0) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e0,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_e1);
              bVar2 = cmMakefile::IsOn(pcVar1,&local_e0);
              std::__cxx11::string::~string((string *)&local_e0);
              std::allocator<char>::~allocator(&local_e1);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                this_local._7_1_ = 1;
                goto LAB_00397b16;
              }
              local_6c = AUTHOR_WARNING;
            }
            else {
              local_6e = 1;
              local_6c = AUTHOR_ERROR;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&stack0xffffffffffffff98);
          }
          else {
            pbVar3 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&stack0xffffffffffffff98);
            bVar2 = std::operator==(pbVar3,"STATUS");
            if (bVar2) {
              local_6d = 1;
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&stack0xffffffffffffff98);
            }
            else {
              pbVar3 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&stack0xffffffffffffff98);
              bVar2 = std::operator==(pbVar3,"DEPRECATION");
              if (bVar2) {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_108,"CMAKE_ERROR_DEPRECATED",&local_109);
                bVar2 = cmMakefile::IsOn(pcVar1,&local_108);
                std::__cxx11::string::~string((string *)&local_108);
                std::allocator<char>::~allocator(&local_109);
                if (bVar2) {
                  local_6e = 1;
                  local_6c = DEPRECATION_ERROR;
                }
                else {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::allocator<char>::allocator();
                  message.field_2._M_local_buf[0xe] = '\0';
                  message.field_2._M_local_buf[0xd] = '\0';
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_130,"CMAKE_WARN_DEPRECATED",&local_131);
                  bVar2 = cmMakefile::IsSet(pcVar1,&local_130);
                  local_25a = true;
                  if (bVar2) {
                    pcVar1 = (this->super_cmCommand).Makefile;
                    std::allocator<char>::allocator();
                    message.field_2._M_local_buf[0xe] = '\x01';
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_158,"CMAKE_WARN_DEPRECATED",
                               (allocator<char> *)(message.field_2._M_local_buf + 0xf));
                    message.field_2._M_local_buf[0xd] = '\x01';
                    local_25a = cmMakefile::IsOn(pcVar1,&local_158);
                  }
                  if ((message.field_2._M_local_buf[0xd] & 1U) != 0) {
                    std::__cxx11::string::~string((string *)&local_158);
                  }
                  if ((message.field_2._M_local_buf[0xe] & 1U) != 0) {
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(message.field_2._M_local_buf + 0xf));
                  }
                  std::__cxx11::string::~string((string *)&local_130);
                  std::allocator<char>::~allocator(&local_131);
                  if (local_25a == false) {
                    this_local._7_1_ = 1;
                    goto LAB_00397b16;
                  }
                  local_6c = DEPRECATION_WARNING;
                }
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&stack0xffffffffffffff98);
              }
            }
          }
        }
      }
    }
    local_198._M_current = cStack_68._M_current;
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
    local_190 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (local_198,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_1a0);
    std::__cxx11::string::string((string *)&m);
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_180,&local_190,(string *)&m);
    std::__cxx11::string::~string((string *)&m);
    if (local_6c == MESSAGE) {
      if ((local_6d & 1) == 0) {
        cmSystemTools::Message((string *)local_180,(char *)0x0);
      }
      else {
        cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,(string *)local_180,-1.0);
      }
    }
    else {
      this_00 = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
      t = local_6c;
      local_1d8._16_8_ = this_00;
      cmMakefile::GetBacktrace((cmMakefile *)local_1d8);
      cmMessenger::DisplayMessage(this_00,t,(string *)local_180,(cmListFileBacktrace *)local_1d8);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1d8);
    }
    if ((local_6e & 1) != 0) {
      cmSystemTools::SetFatalErrorOccured();
    }
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_180);
  }
LAB_00397b16:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMessageCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator i = args.begin();

  MessageType type = MessageType::MESSAGE;
  bool status = false;
  bool fatal = false;
  if (*i == "SEND_ERROR") {
    type = MessageType::FATAL_ERROR;
    ++i;
  } else if (*i == "FATAL_ERROR") {
    fatal = true;
    type = MessageType::FATAL_ERROR;
    ++i;
  } else if (*i == "WARNING") {
    type = MessageType::WARNING;
    ++i;
  } else if (*i == "AUTHOR_WARNING") {
    if (this->Makefile->IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
        !this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS")) {
      fatal = true;
      type = MessageType::AUTHOR_ERROR;
    } else if (!this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
      type = MessageType::AUTHOR_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "STATUS") {
    status = true;
    ++i;
  } else if (*i == "DEPRECATION") {
    if (this->Makefile->IsOn("CMAKE_ERROR_DEPRECATED")) {
      fatal = true;
      type = MessageType::DEPRECATION_ERROR;
    } else if ((!this->Makefile->IsSet("CMAKE_WARN_DEPRECATED") ||
                this->Makefile->IsOn("CMAKE_WARN_DEPRECATED"))) {
      type = MessageType::DEPRECATION_WARNING;
    } else {
      return true;
    }
    ++i;
  }

  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());

  if (type != MessageType::MESSAGE) {
    // we've overridden the message type, above, so display it directly
    cmMessenger* m = this->Makefile->GetMessenger();
    m->DisplayMessage(type, message, this->Makefile->GetBacktrace());
  } else {
    if (status) {
      this->Makefile->DisplayStatus(message, -1);
    } else {
      cmSystemTools::Message(message);
    }
  }
  if (fatal) {
    cmSystemTools::SetFatalErrorOccured();
  }
  return true;
}